

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gb_Oscs.cpp
# Opt level: O0

void __thiscall Gb_Square::reset(Gb_Square *this)

{
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 0x68) = 0;
  *(undefined4 *)(in_RDI + 100) = 0;
  *(undefined4 *)(in_RDI + 0x60) = 0;
  Gb_Env::reset((Gb_Env *)0x979cc3);
  return;
}

Assistant:

void Gb_Square::reset()
{
	phase = 0;
	sweep_freq = 0;
	sweep_delay = 0;
	Gb_Env::reset();
}